

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

int __thiscall QUndoViewPrivate::init(QUndoViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QUndoView *pQVar2;
  QUndoModel *pQVar3;
  QItemSelectionModel *pQVar4;
  QObject *unaff_retaddr;
  QUndoModel *in_stack_00000008;
  QUndoView *q;
  
  pQVar2 = q_func(this);
  pQVar3 = (QUndoModel *)operator_new(0x40);
  QUndoModel::QUndoModel(in_stack_00000008,unaff_retaddr);
  this->model = pQVar3;
  (**(code **)(*(long *)&(pQVar2->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea
                         .super_QFrame.super_QWidget + 0x1c8))(pQVar2,this->model);
  pQVar4 = QUndoModel::selectionModel(this->model);
  iVar1 = (**(code **)(*(long *)&(pQVar2->super_QListView).super_QAbstractItemView.
                                 super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
                    (pQVar2,pQVar4);
  return iVar1;
}

Assistant:

void QUndoViewPrivate::init()
{
    Q_Q(QUndoView);

    model = new QUndoModel(q);
    q->setModel(model);
    q->setSelectionModel(model->selectionModel());
}